

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.h
# Opt level: O2

void __thiscall
jrtplib::RTPFakeTransmissionInfo::~RTPFakeTransmissionInfo(RTPFakeTransmissionInfo *this)

{
  (this->super_RTPTransmissionInfo)._vptr_RTPTransmissionInfo =
       (_func_int **)&PTR__RTPFakeTransmissionInfo_0014fb60;
  std::__cxx11::_List_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_clear
            (&(this->localIPlist).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

~RTPFakeTransmissionInfo()								{ }